

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error FT_CMap_New(FT_CMap_Class clazz,FT_Pointer init_data,FT_CharMap charmap,
                    FT_CMap_conflict *acmap)

{
  FT_Face pFVar1;
  FT_Memory pFVar2;
  size_t __n;
  FT_CMap_DoneFunc p_Var3;
  FT_Encoding FVar4;
  FT_UShort FVar5;
  FT_UShort FVar6;
  FT_CMap __s;
  FT_CharMap *ppFVar7;
  int iVar8;
  FT_Error local_34 [2];
  FT_Error error;
  
  local_34[0] = 0;
  if (charmap == (FT_CharMap)0x0 || clazz == (FT_CMap_Class)0x0) {
    return 6;
  }
  pFVar1 = charmap->face;
  if (pFVar1 == (FT_Face)0x0) {
    return 6;
  }
  pFVar2 = pFVar1->memory;
  __n = clazz->size;
  if ((long)__n < 1) {
    __s = (FT_CMap)0x0;
    iVar8 = 6;
    if (__n == 0) {
      iVar8 = 0;
    }
  }
  else {
    __s = (FT_CMap)(*pFVar2->alloc)(pFVar2,__n);
    iVar8 = (uint)(__s == (FT_CMap)0x0) << 6;
  }
  if ((0 < (long)__n) && (iVar8 == 0)) {
    memset(__s,0,__n);
  }
  local_34[0] = iVar8;
  if (iVar8 == 0) {
    FVar4 = charmap->encoding;
    FVar5 = charmap->platform_id;
    FVar6 = charmap->encoding_id;
    (__s->charmap).face = charmap->face;
    (__s->charmap).encoding = FVar4;
    (__s->charmap).platform_id = FVar5;
    (__s->charmap).encoding_id = FVar6;
    __s->clazz = clazz;
    if ((clazz->init == (FT_CMap_InitFunc)0x0) ||
       (local_34[0] = (*clazz->init)(__s,init_data), local_34[0] == 0)) {
      ppFVar7 = (FT_CharMap *)
                ft_mem_realloc(pFVar2,8,(long)pFVar1->num_charmaps,(long)pFVar1->num_charmaps + 1,
                               pFVar1->charmaps,local_34);
      pFVar1->charmaps = ppFVar7;
      if (local_34[0] == 0) {
        iVar8 = pFVar1->num_charmaps;
        pFVar1->num_charmaps = iVar8 + 1;
        ppFVar7[iVar8] = &__s->charmap;
        goto LAB_001ee076;
      }
    }
    pFVar2 = ((__s->charmap).face)->memory;
    p_Var3 = __s->clazz->done;
    if (p_Var3 != (FT_CMap_DoneFunc)0x0) {
      (*p_Var3)(__s);
    }
    (*pFVar2->free)(pFVar2,__s);
    __s = (FT_CMap_conflict)0x0;
  }
LAB_001ee076:
  if (acmap != (FT_CMap_conflict *)0x0) {
    *acmap = __s;
  }
  return local_34[0];
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_CMap_New( FT_CMap_Class  clazz,
               FT_Pointer     init_data,
               FT_CharMap     charmap,
               FT_CMap       *acmap )
  {
    FT_Error   error = FT_Err_Ok;
    FT_Face    face;
    FT_Memory  memory;
    FT_CMap    cmap = NULL;


    if ( !clazz || !charmap || !charmap->face )
      return FT_THROW( Invalid_Argument );

    face   = charmap->face;
    memory = FT_FACE_MEMORY( face );

    if ( !FT_ALLOC( cmap, clazz->size ) )
    {
      cmap->charmap = *charmap;
      cmap->clazz   = clazz;

      if ( clazz->init )
      {
        error = clazz->init( cmap, init_data );
        if ( error )
          goto Fail;
      }

      /* add it to our list of charmaps */
      if ( FT_RENEW_ARRAY( face->charmaps,
                           face->num_charmaps,
                           face->num_charmaps + 1 ) )
        goto Fail;

      face->charmaps[face->num_charmaps++] = (FT_CharMap)cmap;
    }

  Exit:
    if ( acmap )
      *acmap = cmap;

    return error;

  Fail:
    ft_cmap_done_internal( cmap );
    cmap = NULL;
    goto Exit;
  }